

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall
glu::Texture1DArray::Texture1DArray
          (Texture1DArray *this,RenderContext *context,deUint32 sizedFormat,int width,int numLevels)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  Functions *gl;
  int local_24;
  int local_20;
  int numLevels_local;
  int width_local;
  deUint32 sizedFormat_local;
  RenderContext *context_local;
  Texture1DArray *this_local;
  
  this->m_context = context;
  this->m_format = sizedFormat;
  local_24 = numLevels;
  local_20 = width;
  numLevels_local = sizedFormat;
  _width_local = context;
  context_local = (RenderContext *)this;
  register0x00000000 = mapGLInternalFormat(sizedFormat);
  tcu::Texture1DArray::Texture1DArray
            (&this->m_refTexture,(TextureFormat *)((long)&gl + 4),local_20,local_24);
  this->m_glTexture = 0;
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6f8))(1,&this->m_glTexture);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  checkError(err,"glGenTextures() failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x1ee);
  return;
}

Assistant:

Texture1DArray::Texture1DArray (const RenderContext& context, deUint32 sizedFormat, int width, int numLevels)
	: m_context			(context)
	, m_format			(sizedFormat)
	, m_refTexture		(mapGLInternalFormat(sizedFormat), width, numLevels)
	, m_glTexture		(0)
{
	const glw::Functions& gl = m_context.getFunctions();
	gl.genTextures(1, &m_glTexture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");
}